

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascReadFile.cpp
# Opt level: O0

DWORD CascGetFileSize(HANDLE hFile,PDWORD pdwFileSizeHigh)

{
  DWORD dwErrCode;
  TCascFile *hf_00;
  int nError;
  TCascFile *hf;
  PDWORD pdwFileSizeHigh_local;
  HANDLE hFile_local;
  
  hf_00 = IsValidCascFileHandle(hFile);
  if (hf_00 == (TCascFile *)0x0) {
    SetLastError(9);
    hFile_local._4_4_ = 0xffffffff;
  }
  else {
    if (hf_00->ContentSize == 0xffffffff) {
      dwErrCode = EnsureFileFramesLoaded(hf_00);
      if (dwErrCode != 0) {
        SetLastError(dwErrCode);
        return 0xffffffff;
      }
      if (hf_00->ContentSize == 0xffffffff) {
        __assert_fail("hf->ContentSize != CASC_INVALID_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascReadFile.cpp"
                      ,0x267,"DWORD CascGetFileSize(HANDLE, PDWORD)");
      }
    }
    if (pdwFileSizeHigh != (PDWORD)0x0) {
      *pdwFileSizeHigh = 0;
    }
    hFile_local._4_4_ = hf_00->ContentSize;
  }
  return hFile_local._4_4_;
}

Assistant:

DWORD WINAPI CascGetFileSize(HANDLE hFile, PDWORD pdwFileSizeHigh)
{
    TCascFile * hf;
    int nError;

    CASCLIB_UNUSED(pdwFileSizeHigh);

    // Validate the file handle
    if((hf = IsValidCascFileHandle(hFile)) == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return CASC_INVALID_SIZE;
    }

    // Someone may have provided file content size.
    // If yes, do not load the frames, as it's not necessary.
    if(hf->ContentSize == CASC_INVALID_SIZE)
    {
        // Make sure that the file header area is loaded
        nError = EnsureFileFramesLoaded(hf);
        if(nError != ERROR_SUCCESS)
        {
            SetLastError(nError);
            return CASC_INVALID_SIZE;
        }

        // The content size should be loaded from the frames
        assert(hf->ContentSize != CASC_INVALID_SIZE);
    }

    // Give the file size to the caller
    if(pdwFileSizeHigh != NULL)
        *pdwFileSizeHigh = 0;
    return hf->ContentSize;
}